

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cc
# Opt level: O0

void __thiscall Generator::Generate(Generator *this)

{
  __tuple_element_t<2UL,_tuple<int,_double,_double>_> _Var1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  void *__src;
  reference piVar7;
  uint *puVar8;
  __tuple_element_t<1UL,_tuple<int,_double,_double>_> *p_Var9;
  __tuple_element_t<2UL,_tuple<int,_double,_double>_> *p_Var10;
  char *__s2;
  ulong *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  double loss;
  double geo_mean_guesses;
  int num_clues;
  tuple<int,_double,_double> eval_stats;
  int j;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int dropped;
  string *pattern;
  size_t which;
  uint64_t i;
  size_t size;
  char puzzle [729];
  key_type *in_stack_fffffffffffffb48;
  key_type *in_stack_fffffffffffffb50;
  pair<double,_char_*> *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  __normal_iterator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  in_stack_fffffffffffffb68;
  __normal_iterator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __first;
  iterator in_stack_fffffffffffffb90;
  Util *in_stack_fffffffffffffb98;
  _Self local_438;
  _Self local_430;
  iterator in_stack_fffffffffffffbd8;
  iterator in_stack_fffffffffffffbe0;
  allocator local_3e1;
  string local_3e0 [32];
  _Self local_3c0 [3];
  allocator local_3a1;
  string local_3a0 [32];
  _Self local_380;
  __tuple_element_t<2UL,_tuple<int,_double,_double>_> local_378;
  __tuple_element_t<1UL,_tuple<int,_double,_double>_> local_370;
  uint local_364;
  int local_348;
  undefined4 local_344;
  int *local_340;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_338;
  undefined1 local_330 [24];
  undefined1 *local_318;
  int local_30c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  ulong local_300;
  ulong local_2f8;
  size_t local_2f0;
  char local_2e8 [81];
  undefined1 local_297;
  char *in_stack_fffffffffffffe70;
  Generator *in_stack_fffffffffffffe78;
  
  iVar4 = 0x51;
  if ((*(byte *)((long)in_RDI + 0x2e) & 1) != 0) {
    iVar4 = 0x2d9;
  }
  local_2f0 = (size_t)iVar4;
  local_2f8 = 0;
  do {
    if (*in_RDI <= local_2f8) {
      return;
    }
    uVar3 = Util::RandomUInt((Util *)0x104cd9);
    sVar5 = std::
            vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(in_RDI + 0x3b4));
    local_300 = (ulong)uVar3 % sVar5;
    pvVar6 = std::
             vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(in_RDI + 0x3b4),local_300);
    local_308 = &pvVar6->second;
    __src = (void *)std::__cxx11::string::c_str();
    memcpy(local_2e8,__src,local_2f0);
    if (local_2f0 == 0x51) {
      local_297 = 0;
    }
    local_30c = 0;
    Util::Permutation(in_stack_fffffffffffffb98,(size_t)in_stack_fffffffffffffb90._M_node);
    local_318 = local_330;
    local_338._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb48);
    local_340 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb48);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffb50,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffb48), bVar2) {
      piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_338);
      local_348 = *piVar7;
      if (local_30c == (int)in_RDI[4]) break;
      if (local_2e8[local_348] == '.') {
        if ((*(byte *)((long)in_RDI + 0x2e) & 1) != 0) {
          local_2e8[local_348] = (char)(local_348 % 9) + '1';
          local_30c = local_30c + 1;
        }
      }
      else if ((*(byte *)((long)in_RDI + 0x2e) & 1) == 0) {
        local_2e8[local_348] = '.';
        local_30c = local_30c + 1;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_338);
    }
    local_344 = 5;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
    if ((int)in_RDI[4] < 1) {
LAB_00104f2c:
      Evaluate(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      puVar8 = (uint *)std::get<0ul,int,double,double>((tuple<int,_double,_double> *)0x104f53);
      local_364 = *puVar8;
      p_Var9 = std::get<1ul,int,double,double>((tuple<int,_double,_double> *)0x104f69);
      local_370 = *p_Var9;
      p_Var10 = std::get<2ul,int,double,double>((tuple<int,_double,_double> *)0x104f83);
      local_378 = *p_Var10;
      if ((int)in_RDI[4] < 1) {
LAB_001050e2:
        if ((*(byte *)((long)in_RDI + 0x2c) & 1) != 0) {
          printf("%.729s %d %.1f %.2f\n",local_370,local_378,local_2e8,(ulong)local_364);
        }
        _Var1 = local_378;
        pvVar6 = std::
                 vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::front((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffb50);
        if (_Var1 <= pvVar6->first) {
          if ((*(byte *)((long)in_RDI + 0x2c) & 1) == 0) {
            printf("%.729s %d %.1f %.2f\n",local_370,local_378,local_2e8,(ulong)local_364);
          }
          __first._M_current =
               (pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(in_RDI + 0x3b7);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3e0,local_2e8,&local_3e1);
          pVar11 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)__first._M_current,(value_type *)in_stack_fffffffffffffb68._M_current
                           );
          in_stack_fffffffffffffb68._M_current =
               (pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)pVar11.first._M_node;
          in_stack_fffffffffffffb67 = pVar11.second;
          std::__cxx11::string::~string(local_3e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
          in_stack_fffffffffffffb50 = (key_type *)(in_RDI + 0x3b4);
          std::make_pair<double&,char(&)[729]>
                    ((double *)in_stack_fffffffffffffb50,(char (*) [729])in_stack_fffffffffffffb48);
          std::
          vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>
          ::emplace_back<std::pair<double,char*>>
                    ((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                     in_stack_fffffffffffffb58);
          std::
          vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffb48);
          std::
          vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffb48);
          std::
          push_heap<__gnu_cxx::__normal_iterator<std::pair<double,std::__cxx11::string>*,std::vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>>>
                    ((__normal_iterator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      )in_stack_fffffffffffffbe0._M_current,
                     (__normal_iterator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      )in_stack_fffffffffffffbd8._M_current);
          in_stack_fffffffffffffbe0 =
               std::
               vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffb48);
          in_stack_fffffffffffffbd8 =
               std::
               vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffb48);
          std::
          pop_heap<__gnu_cxx::__normal_iterator<std::pair<double,std::__cxx11::string>*,std::vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>>>
                    (__first,in_stack_fffffffffffffb68);
          in_stack_fffffffffffffb58 = (pair<double,_char_*> *)(in_RDI + 0x3b7);
          std::
          vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::back((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffb50);
          local_430._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
          local_438._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb48);
          bVar2 = std::operator!=(&local_430,&local_438);
          if (bVar2) {
            in_stack_fffffffffffffb48 = (key_type *)(in_RDI + 0x3b7);
            std::
            vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::back((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffb50);
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
          }
          std::
          vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop_back((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x1053dd);
        }
      }
      else {
        __s2 = (char *)std::__cxx11::string::c_str();
        iVar4 = strncmp(local_2e8,__s2,0x2d9);
        if (iVar4 != 0) {
          in_stack_fffffffffffffb98 = (Util *)(in_RDI + 0x3b7);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3a0,local_2e8,&local_3a1);
          in_stack_fffffffffffffb90 =
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
          local_380._M_node = in_stack_fffffffffffffb90._M_node;
          local_3c0[0]._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb48);
          bVar2 = std::operator!=(&local_380,local_3c0);
          std::__cxx11::string::~string(local_3a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
          if (!bVar2) goto LAB_001050e2;
        }
      }
    }
    else {
      bVar2 = TdokuConstrain(SUB81((ulong)in_stack_fffffffffffffb50 >> 0x38,0),
                             (char *)in_stack_fffffffffffffb48);
      if (bVar2) {
        if ((*(byte *)((long)in_RDI + 0x2d) & 1) != 0) {
          TdokuMinimize(SUB81((ulong)in_stack_fffffffffffffb50 >> 0x38,0),
                        SUB81((ulong)in_stack_fffffffffffffb50 >> 0x30,0),
                        (char *)in_stack_fffffffffffffb48);
        }
        goto LAB_00104f2c;
      }
    }
    local_2f8 = local_2f8 + 1;
  } while( true );
}

Assistant:

void Generate() {
        char puzzle[729];

        size_t size = options_.pencilmark ? 729 : 81;
        for (uint64_t i = 0; i < options_.max_puzzles; i++) {
            // draw a puzzle or pattern from the pool
            size_t which = util_.RandomUInt() % pattern_heap.size();
            string &pattern = pattern_heap[which].second;
            memcpy(puzzle, pattern.c_str(), size);
            if (size == 81) puzzle[81] = '\0';

            // randomly drop clues to unconstrain
            int dropped = 0;
            for (int j : util_.Permutation(size)) {
                if (dropped == options_.clues_to_drop) {
                    break;
                }
                if (puzzle[j] == '.') {
                    if (options_.pencilmark) {
                        puzzle[j] = (char) ('1' + (j % 9));
                        dropped++;
                    }
                } else {
                    if (!options_.pencilmark) {
                        puzzle[j] = '.';
                        dropped++;
                    }
                }
            }

            // randomly complete and minimize

            if (options_.clues_to_drop > 0) {
                if (!TdokuConstrain(options_.pencilmark, puzzle)) {
                    continue;
                }
                if (options_.minimize) {
                    TdokuMinimize(options_.pencilmark, false, puzzle);
                }
            }

            // evaluate difficulty via guess counting
            auto eval_stats = Evaluate(puzzle);
            int num_clues = get<0>(eval_stats);
            double geo_mean_guesses = get<1>(eval_stats);
            double loss = get<2>(eval_stats);

            // skip if the puzzle is a duplicate of one still in the pool
            if (options_.clues_to_drop > 0) {
                if (strncmp(puzzle, pattern.c_str(), 729) == 0) {
                    continue;
                }
                if (pattern_set.find(puzzle) != pattern_set.end()) {
                    continue;
                }
            }

            if (options_.display_all) {
                printf("%.729s %d %.1f %.2f\n", puzzle, num_clues, geo_mean_guesses, loss);
            }

            // skip if the puzzle's loss is greater than the highest in the pool
            if (loss > pattern_heap.front().first) {
                continue;
            }

            if (!options_.display_all) {
                printf("%.729s %d %.1f %.2f\n", puzzle, num_clues, geo_mean_guesses, loss);
            }

            // add the generated puzzle to the pool and kick out the one with highest loss
            pattern_set.insert(puzzle);
            pattern_heap.emplace_back(make_pair(loss, puzzle));
            push_heap(pattern_heap.begin(), pattern_heap.end());
            pop_heap(pattern_heap.begin(), pattern_heap.end());
            if (pattern_set.find(pattern_heap.back().second) != pattern_set.end()) {
                pattern_set.erase(pattern_heap.back().second);
            }
            pattern_heap.pop_back();
        }
    }